

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_optimizer_options.cpp
# Opt level: O1

spv_optimizer_options spvOptimizerOptionsCreate(void)

{
  spv_optimizer_options psVar1;
  
  psVar1 = (spv_optimizer_options)operator_new(0x3c);
  psVar1->run_validator_ = true;
  (psVar1->val_options_).universal_limits_.max_struct_members = 0x3fff;
  (psVar1->val_options_).universal_limits_.max_struct_depth = 0xff;
  (psVar1->val_options_).universal_limits_.max_local_variables = 0x7ffff;
  (psVar1->val_options_).universal_limits_.max_global_variables = 0xffff;
  (psVar1->val_options_).universal_limits_.max_switch_branches = 0x3fff;
  (psVar1->val_options_).universal_limits_.max_function_args = 0xff;
  (psVar1->val_options_).universal_limits_.max_control_flow_nesting_depth = 0x3ff;
  (psVar1->val_options_).universal_limits_.max_access_chain_indexes = 0xff;
  (psVar1->val_options_).universal_limits_.max_id_bound = 0x3fffff;
  (psVar1->val_options_).relax_struct_store = false;
  (psVar1->val_options_).relax_logical_pointer = false;
  (psVar1->val_options_).relax_block_layout = false;
  (psVar1->val_options_).uniform_buffer_standard_layout = false;
  (psVar1->val_options_).scalar_block_layout = false;
  (psVar1->val_options_).workgroup_scalar_block_layout = false;
  (psVar1->val_options_).skip_block_layout = false;
  (psVar1->val_options_).allow_localsizeid = false;
  (psVar1->val_options_).allow_localsizeid = false;
  (psVar1->val_options_).allow_offset_texture_operand = false;
  (psVar1->val_options_).allow_vulkan_32_bit_bitwise = false;
  (psVar1->val_options_).before_hlsl_legalization = false;
  (psVar1->val_options_).use_friendly_names = true;
  psVar1->max_id_bound_ = 0x3fffff;
  psVar1->preserve_bindings_ = false;
  psVar1->preserve_spec_constants_ = false;
  return psVar1;
}

Assistant:

SPIRV_TOOLS_EXPORT spv_optimizer_options spvOptimizerOptionsCreate(void) {
  return new spv_optimizer_options_t();
}